

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools.c
# Opt level: O0

void AbsPath(tchar_t *Abs,int AbsLen,tchar_t *Path,tchar_t *Base)

{
  tchar_t *ptVar1;
  char *pcVar2;
  tchar_t *MimeEnd;
  tchar_t *b;
  tchar_t *a;
  bool_t HasHost;
  tchar_t *s;
  tchar_t *Base_local;
  tchar_t *Path_local;
  tchar_t *ptStack_10;
  int AbsLen_local;
  tchar_t *Abs_local;
  
  s = Base;
  Base_local = Path;
  Path_local._4_4_ = AbsLen;
  ptStack_10 = Abs;
  if ((((Base == (tchar_t *)0x0) ||
       (ptVar1 = GetProtocol(Base,(tchar_t *)0x0,0,(bool_t *)0x0), ptVar1 == s)) ||
      ((*Base_local != '/' && (*Base_local != '\\')))) ||
     ((Base_local[1] == '/' || (Base_local[1] == '\\')))) {
    if ((((s == (tchar_t *)0x0) ||
         (ptVar1 = GetProtocol(Base_local,(tchar_t *)0x0,0,(bool_t *)0x0), ptVar1 != Base_local)) ||
        (*Base_local == '/')) ||
       ((*Base_local == '\\' ||
        (((*Base_local != '\0' && (Base_local[1] == ':')) &&
         ((Base_local[2] == '\\' || (Base_local[2] == '\0')))))))) {
      *ptStack_10 = '\0';
    }
    else {
      ptVar1 = GetProtocol(s,(tchar_t *)0x0,0,(bool_t *)0x0);
      tcscpy_s(ptStack_10,(long)Path_local._4_4_,s);
      if (*ptVar1 != '\0') {
        AddPathDelimiter(ptStack_10,(long)Path_local._4_4_);
      }
    }
  }
  else {
    tcscpy_s(ptStack_10,(long)Path_local._4_4_,s);
    HasHost = (bool_t)GetProtocol(ptStack_10,(tchar_t *)0x0,0,(bool_t *)&a);
    if (a == (tchar_t *)0x0) {
      Base_local = Base_local + 1;
      *(tchar_t *)HasHost = '\0';
    }
    else {
      b = strchr((char *)HasHost,0x5c);
      pcVar2 = strchr((char *)HasHost,0x2f);
      if ((b == (char *)0x0) || ((pcVar2 != (char *)0x0 && (pcVar2 < b)))) {
        b = pcVar2;
      }
      if (b != (tchar_t *)0x0) {
        *b = '\0';
      }
    }
  }
  tcscat_s(ptStack_10,(long)Path_local._4_4_,Base_local);
  AbsPathNormalize(ptStack_10);
  return;
}

Assistant:

void AbsPath(tchar_t* Abs, int AbsLen, const tchar_t* Path, const tchar_t* Base)
{
    if (Base && GetProtocol(Base,NULL,0,NULL)!=Base && (Path[0] == '/' || Path[0] == '\\') &&
        (Path[1] != '/' && Path[1] != '\\'))
    {
        tchar_t* s;
        bool_t HasHost;

        tcscpy_s(Abs,AbsLen,Base);
        s = (tchar_t*)GetProtocol(Abs,NULL,0,&HasHost);
        if (!HasHost)
        {
            // keep "mime://" from Base
            ++Path;
            *s = 0;
        }
        else
        {
            // keep "mime://host" from Base
            tchar_t *a,*b;
            a = tcschr(s,'\\');
            b = tcschr(s,'/');
            if (!a || (b && b<a))
                a=b;
            if (a)
                *a=0;
        }
    }
    else
    if (Base && GetProtocol(Path,NULL,0,NULL)==Path && Path[0] != '/' && Path[0] != '\\' &&
        !(Path[0] && Path[1]==':' && (Path[2]=='\\' || Path[2]=='\0')))
    {
        // doesn't have mime or drive letter or pathdelimiter at the start
        const tchar_t* MimeEnd = GetProtocol(Base,NULL,0,NULL);
        tcscpy_s(Abs,AbsLen,Base);

#if defined(TARGET_WIN)
        if (MimeEnd==Base)
            AddPathDelimiter(Abs,AbsLen);
        else
#endif
        if (MimeEnd[0])
            AddPathDelimiter(Abs,AbsLen);
    }
    else
        Abs[0] = 0;

    tcscat_s(Abs,AbsLen,Path);
    AbsPathNormalize(Abs);
}